

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O1

ssize_t __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this,int __fd,void *__buf,size_t __n
          ,int __flags)

{
  long *plVar1;
  PromiseArena *pPVar2;
  PromiseArena *pPVar3;
  SegmentBuilder *pSVar4;
  OwnPromiseNode OVar5;
  void *pvVar6;
  undefined4 in_register_00000034;
  long lVar7;
  RawBrandedSchema *this_00;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  OwnPromiseNode local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Disposer *local_38;
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar7 + 0x38))(&local_60);
  plVar1 = *(long **)(lVar7 + 0x38);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(lVar7 + 0x38) = 0;
    (**(code **)**(undefined8 **)(lVar7 + 0x30))
              (*(undefined8 **)(lVar7 + 0x30),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  OVar5.ptr = local_60.ptr;
  pPVar2 = *(PromiseArena **)(lVar7 + 0x40);
  pPVar3 = ((local_60.ptr)->super_PromiseArenaMember).arena;
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_60.ptr - (long)pPVar3) < 0x28) {
    pvVar6 = operator_new(0x400);
    this_00 = (RawBrandedSchema *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
               ::anon_class_8_1_9705db31_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_006f98c0;
    *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPVar2;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_60.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (RawBrandedSchema *)&local_60.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
               ::anon_class_8_1_9705db31_for_func::operator());
    OVar5.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006f98c0;
    OVar5.ptr[-1].super_PromiseArenaMember.arena = pPVar2;
    OVar5.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar3;
  }
  OVar5.ptr = local_60.ptr;
  pSVar4 = *(SegmentBuilder **)(lVar7 + 0x40);
  (this->super_Builder).schema.super_Schema.raw = this_00;
  (this->super_Builder).builder.segment = pSVar4;
  *(undefined4 *)&(this->super_Builder).builder.capTable = local_58;
  *(undefined4 *)((long)&(this->super_Builder).builder.capTable + 4) = uStack_54;
  *(undefined4 *)&(this->super_Builder).builder.data = (undefined4)uStack_50;
  *(undefined4 *)((long)&(this->super_Builder).builder.data + 4) = uStack_50._4_4_;
  *(undefined4 *)&(this->super_Builder).builder.pointers = (undefined4)local_48;
  *(undefined4 *)((long)&(this->super_Builder).builder.pointers + 4) = local_48._4_4_;
  (this->super_Builder).builder.dataSize = (StructDataBitCount)uStack_40;
  *(undefined4 *)&(this->super_Builder).builder.pointerCount = uStack_40._4_4_;
  (this->hook).disposer = local_38;
  uStack_40 = 0;
  local_48 = 0;
  uStack_50 = 0;
  if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_60.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<DynamicStruct> Request<DynamicStruct, DynamicStruct>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  auto resultSchemaCopy = resultSchema;

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([=](Response<AnyPointer>&& response) -> Response<DynamicStruct> {
        return Response<DynamicStruct>(response.getAs<DynamicStruct>(resultSchemaCopy),
                                       kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  DynamicStruct::Pipeline typedPipeline(resultSchema,
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<DynamicStruct>(kj::mv(typedPromise), kj::mv(typedPipeline));
}